

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

png_handle_result_code png_handle_sRGB(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  int iVar1;
  byte local_25;
  png_uint_32 local_24;
  png_byte intent;
  png_inforp ppStack_20;
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  local_24 = length;
  ppStack_20 = info_ptr;
  info_ptr_local = (png_inforp)png_ptr;
  png_crc_read(png_ptr,&local_25,1);
  iVar1 = png_crc_finish((png_structrp)info_ptr_local,0);
  if (iVar1 == 0) {
    if (local_25 < 4) {
      png_set_sRGB((png_const_structrp)info_ptr_local,ppStack_20,(uint)local_25);
      if ((((unkuint10)info_ptr_local[1].trans_color & 0x80) == 0) ||
         (*(int *)((long)&info_ptr_local[2].rowbytes + 4) == 0)) {
        *(undefined4 *)((long)&info_ptr_local[2].rowbytes + 4) = 0xb18f;
      }
      png_ptr_local._4_4_ = handled_ok;
    }
    else {
      png_chunk_benign_error((png_const_structrp)info_ptr_local,"invalid");
      png_ptr_local._4_4_ = handled_error;
    }
  }
  else {
    png_ptr_local._4_4_ = handled_error;
  }
  return png_ptr_local._4_4_;
}

Assistant:

static png_handle_result_code /* PRIVATE */
png_handle_sRGB(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte intent;

   png_debug(1, "in png_handle_sRGB");

   png_crc_read(png_ptr, &intent, 1);

   if (png_crc_finish(png_ptr, 0) != 0)
      return handled_error;

   /* This checks the range of the "rendering intent" because it is specified in
    * the PNG spec itself; the "reserved" values will result in the chunk not
    * being accepted, just as they do with the various "reserved" values in
    * IHDR.
    */
   if (intent > 3/*PNGv3 spec*/)
   {
      png_chunk_benign_error(png_ptr, "invalid");
      return handled_error;
   }

   png_set_sRGB(png_ptr, info_ptr, intent);
   /* NOTE: png_struct::chromaticities is not set here because the RGB to gray
    * coefficients are known without a need for the chromaticities.
    */

#ifdef PNG_READ_GAMMA_SUPPORTED
      /* PNGv3: chunk precedence for gamma is cICP, [iCCP], sRGB, gAMA.  iCCP is
       * not supported by libpng so the only requirement is to check for cICP
       * setting the gamma (this is NYI, but this check is safe.)
       */
      if (!png_has_chunk(png_ptr, cICP) || png_ptr->chunk_gamma == 0)
         png_ptr->chunk_gamma = PNG_GAMMA_sRGB_INVERSE;
#endif /*READ_GAMMA*/

   return handled_ok;
   PNG_UNUSED(length)
}